

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O3

void form_local_comm(int orig_num_sends,int *orig_send_procs,int *orig_send_ptr,
                    int *orig_send_indices,vector<int,_std::allocator<int>_> *nodes_to_local,
                    comm_data *send_data,comm_data *recv_data,comm_data *param_8,
                    vector<int,_std::allocator<int>_> *recv_idx_nodes,MPI_Comm mpi_comm,
                    topo_data *topo_info,int tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  int *piVar5;
  comm_data *pcVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  size_type sVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int local_rank;
  vector<int,_std::allocator<int>_> send_sizes;
  vector<int,_std::allocator<int>_> recv_buffer;
  vector<int,_std::allocator<int>_> local_idx;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> send_requests;
  vector<int,_std::allocator<int>_> send_buffer;
  vector<int,_std::allocator<int>_> send_idx_node;
  int num_procs;
  int rank;
  vector<int,_std::allocator<int>_> orig_to_node;
  MPI_Status recv_status;
  int local_168;
  int local_164;
  comm_data *local_160;
  allocator_type local_151;
  vector<int,_std::allocator<int>_> *local_150;
  int *local_148;
  int local_13c;
  vector<int,_std::allocator<int>_> local_138;
  vector<int,_std::allocator<int>_> local_118;
  ulong local_100;
  vector<int,_std::allocator<int>_> local_f8;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> local_d8;
  vector<int,_std::allocator<int>_> local_b8;
  pointer local_98;
  int *local_90;
  vector<int,_std::allocator<int>_> local_88;
  undefined1 local_70 [4];
  undefined1 local_6c [4];
  vector<int,_std::allocator<int>_> local_68;
  int local_48 [6];
  
  uVar12 = (ulong)(uint)orig_num_sends;
  local_160 = send_data;
  local_150 = nodes_to_local;
  local_148 = orig_send_procs;
  MPI_Comm_rank(&ompi_mpi_comm_world,local_6c);
  MPI_Comm_size(&ompi_mpi_comm_world,local_70);
  MPI_Comm_rank(*(undefined8 *)(mpi_comm + 0x10),&local_13c);
  MPI_Comm_size(*(undefined8 *)(mpi_comm + 0x10),&local_164);
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_d8.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_68,(long)orig_num_sends);
  std::vector<int,_std::allocator<int>_>::resize(&local_f8,(long)local_164);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_138,(long)local_164,(value_type_conflict *)&local_88);
  comm_data::init_num_data(local_160,local_164);
  comm_data::init_num_data(recv_data,local_164);
  comm_data::init_num_data(param_8,local_164);
  if (0 < orig_num_sends) {
    piVar4 = (local_150->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      iVar16 = local_148[uVar13];
      local_168 = orig_send_ptr[uVar13 + 1] - orig_send_ptr[uVar13];
      iVar7 = iVar16 / *(int *)(mpi_comm + 4);
      if (*(int *)(mpi_comm + 0xc) == iVar7) {
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar13] = -1;
        param_8->procs[param_8->num_msgs] = iVar16 % *(int *)(mpi_comm + 4);
        iVar7 = param_8->size_msgs + local_168;
        param_8->size_msgs = iVar7;
        iVar16 = param_8->num_msgs;
        param_8->num_msgs = iVar16 + 1;
        param_8->indptr[(long)iVar16 + 1] = iVar7;
      }
      else {
        iVar16 = piVar4[iVar7];
        if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar16] == 0) {
          iVar1 = local_160->num_msgs;
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar16] = iVar1;
          local_160->num_msgs = iVar1 + 1;
          local_160->procs[iVar1] = iVar16;
        }
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar13] = iVar7;
        local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar16] =
             local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar16] + local_168;
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  iVar16 = param_8->size_msgs;
  local_100 = uVar12;
  if ((long)iVar16 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (-1 < iVar16) {
      uVar12 = (long)iVar16 << 2;
    }
    piVar8 = (int *)operator_new__(uVar12);
    param_8->indices = piVar8;
  }
  lVar9 = (long)local_160->num_msgs;
  if (lVar9 < 1) {
    piVar8 = local_160->indptr;
  }
  else {
    piVar5 = local_160->procs;
    piVar8 = local_160->indptr;
    lVar11 = 0;
    do {
      iVar16 = piVar5[lVar11];
      piVar8[lVar11 + 1] =
           local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar16] + piVar8[lVar11];
      lVar11 = lVar11 + 1;
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar16] = 0;
      lVar9 = (long)local_160->num_msgs;
    } while (lVar11 < lVar9);
  }
  iVar16 = piVar8[lVar9];
  sVar10 = (size_type)iVar16;
  local_160->size_msgs = iVar16;
  if (sVar10 == 0) {
    sVar10 = 0;
  }
  else {
    uVar12 = 0xffffffffffffffff;
    if (-1 < iVar16) {
      uVar12 = sVar10 * 4;
    }
    piVar8 = (int *)operator_new__(uVar12);
    local_160->indices = piVar8;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_88,sVar10,&local_151);
  param_8->size_msgs = 0;
  if (0 < orig_num_sends) {
    local_148 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_150 = (vector<int,_std::allocator<int>_> *)
                (local_150->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    local_98 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      iVar16 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12];
      iVar7 = orig_send_ptr[uVar12];
      lVar9 = (long)iVar7;
      iVar1 = orig_send_ptr[uVar12 + 1];
      if ((long)iVar16 == -1) {
        if (iVar7 < iVar1) {
          piVar8 = param_8->indices;
          do {
            iVar16 = orig_send_indices[lVar9];
            iVar7 = param_8->size_msgs;
            param_8->size_msgs = iVar7 + 1;
            piVar8[iVar7] = iVar16;
            lVar9 = lVar9 + 1;
          } while (iVar1 != lVar9);
        }
      }
      else if (iVar7 < iVar1) {
        iVar7 = *(int *)((long)&(local_150->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + (long)iVar16 * 4);
        iVar2 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
        piVar8 = local_160->indptr;
        piVar5 = local_160->indices;
        do {
          iVar15 = piVar8[iVar2];
          iVar3 = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7];
          local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar7] = iVar3 + 1;
          lVar11 = (long)iVar15 + (long)iVar3;
          piVar5[lVar11] = orig_send_indices[lVar9];
          *(int *)(CONCAT44(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + lVar11 * 4) = iVar16;
          lVar9 = lVar9 + 1;
        } while (iVar1 != lVar9);
      }
      uVar12 = uVar12 + 1;
      local_90 = orig_send_ptr;
    } while (uVar12 != local_100);
  }
  MPI_Allreduce(1,local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,local_164,&ompi_mpi_int,&ompi_mpi_op_sum,
                *(undefined8 *)(mpi_comm + 0x10));
  pcVar6 = local_160;
  iVar16 = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[local_13c];
  sVar10 = (size_type)iVar16;
  recv_data->size_msgs = iVar16;
  if (sVar10 == 0) {
    sVar10 = 0;
  }
  else {
    uVar12 = 0xffffffffffffffff;
    if (-1 < iVar16) {
      uVar12 = sVar10 * 4;
    }
    piVar8 = (int *)operator_new__(uVar12);
    recv_data->indices = piVar8;
  }
  std::vector<int,_std::allocator<int>_>::resize(recv_idx_nodes,sVar10);
  std::vector<int,_std::allocator<int>_>::resize(&local_b8,(long)pcVar6->size_msgs * 2);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::resize
            (&local_d8,(long)pcVar6->num_msgs);
  iVar16 = 0;
  for (lVar9 = 0; uVar12 = (ulong)pcVar6->num_msgs, lVar9 < (long)uVar12; lVar9 = lVar9 + 1) {
    iVar7 = pcVar6->procs[lVar9];
    iVar1 = pcVar6->indptr[lVar9];
    lVar11 = (long)iVar1;
    iVar2 = pcVar6->indptr[lVar9 + 1];
    iVar15 = iVar16;
    if (iVar1 < iVar2) {
      piVar8 = pcVar6->indices;
      iVar15 = iVar16 + iVar2 * 2 + iVar1 * -2;
      lVar14 = 0;
      do {
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)iVar16 + lVar14 * 2] = piVar8[lVar11 + lVar14];
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)iVar16 + lVar14 * 2 + 1] =
             *(int *)(lVar11 * 4 +
                      CONCAT44(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (iVar2 - lVar11 != lVar14);
    }
    MPI_Isend(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + iVar16,iVar15 - iVar16,&ompi_mpi_int,iVar7,(ulong)topo_info & 0xffffffff,
              *(undefined8 *)(mpi_comm + 0x10),
              local_d8.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar9);
    iVar16 = iVar15;
  }
  if (0 < recv_data->size_msgs) {
    iVar16 = 0;
    do {
      MPI_Probe(0xffffffff,(ulong)topo_info & 0xffffffff,*(undefined8 *)(mpi_comm + 0x10),local_48);
      iVar7 = local_48[0];
      MPI_Get_count(local_48,&ompi_mpi_int,&local_168);
      if ((ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) < (ulong)(long)local_168) {
        std::vector<int,_std::allocator<int>_>::resize(&local_118,(long)local_168);
      }
      MPI_Recv(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,local_168,&ompi_mpi_int,iVar7,
               (ulong)topo_info & 0xffffffff,*(undefined8 *)(mpi_comm + 0x10),local_48);
      if (0 < local_168) {
        lVar9 = (long)iVar16;
        piVar8 = recv_data->indices;
        piVar4 = (recv_idx_nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = 0;
        do {
          *(int *)((long)piVar8 + lVar11 * 2 + lVar9 * 4) =
               local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
          *(int *)((long)piVar4 + lVar11 * 2 + lVar9 * 4) =
               local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11 + 1];
          lVar11 = lVar11 + 2;
          iVar16 = iVar16 + 1;
        } while (lVar11 < local_168);
      }
      recv_data->procs[recv_data->num_msgs] = iVar7;
      recv_data->indptr[(long)recv_data->num_msgs + 1] =
           local_168 / 2 + recv_data->indptr[recv_data->num_msgs];
      recv_data->num_msgs = recv_data->num_msgs + 1;
    } while (iVar16 < recv_data->size_msgs);
    uVar12 = (ulong)(uint)local_160->num_msgs;
  }
  if ((int)uVar12 != 0) {
    MPI_Waitall(uVar12,local_d8.
                       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,0);
  }
  if ((void *)CONCAT44(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void form_local_comm(const int orig_num_sends, const int* orig_send_procs,
        const int* orig_send_ptr, const int* orig_send_indices,
        const std::vector<int>& nodes_to_local, comm_data* send_data,
        comm_data* recv_data, comm_data* local_data,
        std::vector<int>& recv_idx_nodes, MPI_Comm mpi_comm,
        topo_data* topo_info, const int tag)
{
    // MPI_Information
    int rank, num_procs;
    int local_rank, local_num_procs;
    MPI_Comm_rank(mpi_comm, &rank);
    MPI_Comm_size(mpi_comm, &num_procs);
    MPI_Comm& local_comm = topo_info->local_comm;
    MPI_Comm_rank(local_comm, &local_rank);
    MPI_Comm_size(local_comm, &local_num_procs);

    // Declare variables
    int global_proc, local_proc;
    int size, ctr, start_ctr;
    int start, end, node;
    int idx, proc_idx;
    int proc;
    MPI_Status recv_status;

    std::vector<int> send_buffer;
    std::vector<MPI_Request> send_requests;
    std::vector<int> send_sizes;
    std::vector<int> recv_buffer;

    std::vector<int> orig_to_node;
    std::vector<int> local_idx;

    // Initialize variables
    orig_to_node.resize(orig_num_sends);
    local_idx.resize(local_num_procs);
    send_sizes.resize(local_num_procs, 0);

    send_data->init_num_data(local_num_procs);
    recv_data->init_num_data(local_num_procs);
    local_data->init_num_data(local_num_procs);

    // Form local_S_comm
    for (int i = 0; i < orig_num_sends; i++)
    {
        global_proc = orig_send_procs[i];
        size = orig_send_ptr[i+1] - orig_send_ptr[i];
        node = get_node(global_proc, topo_info);
        if (topo_info->rank_node != node)
        {
            local_proc = nodes_to_local[node];
            if (send_sizes[local_proc] == 0)
            {
                local_idx[local_proc] = send_data->num_msgs;
                send_data->procs[send_data->num_msgs++] = local_proc;
            }
            orig_to_node[i] = node;
            send_sizes[local_proc] += size;
        }
        else
        {
            orig_to_node[i] = -1;
            local_data->procs[local_data->num_msgs] = get_local_proc(global_proc, topo_info);
            local_data->size_msgs += size;
            local_data->num_msgs++;
            local_data->indptr[local_data->num_msgs] = local_data->size_msgs;
        }
    }
    if (local_data->size_msgs)
        local_data->indices = new int[local_data->size_msgs];

    for (int i = 0; i < send_data->num_msgs; i++)
    {
        local_proc = send_data->procs[i];
        send_data->indptr[i+1] = send_data->indptr[i] + send_sizes[local_proc];
        send_sizes[local_proc] = 0;
    }
    send_data->size_msgs = send_data->indptr[send_data->num_msgs];

    // Allocate send_indices and fill vector
    if (send_data->size_msgs)
        send_data->indices = new int[send_data->size_msgs];
    std::vector<int> send_idx_node(send_data->size_msgs);
    local_data->size_msgs = 0;
    for (int i = 0; i < orig_num_sends; i++)
    {
        node = orig_to_node[i];
        start = orig_send_ptr[i];
        end = orig_send_ptr[i+1];
        if (node == -1)
        {
            for (int j = start; j < end; j++)
            {
                local_data->indices[local_data->size_msgs++] = orig_send_indices[j];
            }
        }
        else
        {
            local_proc = nodes_to_local[node];
            proc_idx = local_idx[local_proc];
            for (int j = start; j < end; j++)
            {
                idx = send_data->indptr[proc_idx] + send_sizes[local_proc]++;
                send_data->indices[idx] = orig_send_indices[j];
                send_idx_node[idx] = node;
            }
        }
    }

    // Send 'local_S_comm send' info (to form local_S recv)
    MPI_Allreduce(MPI_IN_PLACE, send_sizes.data(), local_num_procs,
            MPI_INT, MPI_SUM, local_comm);
    recv_data->size_msgs = send_sizes[local_rank];
    if (recv_data->size_msgs)
        recv_data->indices = new int[recv_data->size_msgs];
    recv_idx_nodes.resize(recv_data->size_msgs);

    send_buffer.resize(2*send_data->size_msgs);
    send_requests.resize(send_data->num_msgs);
    ctr = 0;
    start_ctr = 0;
    for (int i = 0; i < send_data->num_msgs; i++)
    {
        proc = send_data->procs[i];
        start = send_data->indptr[i];
        end = send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            send_buffer[ctr++] = send_data->indices[j];
            send_buffer[ctr++] = send_idx_node[j];
        }
        MPI_Isend(&send_buffer[start_ctr], ctr - start_ctr ,
                MPI_INT, proc, tag, local_comm, &send_requests[i]);
        start_ctr = ctr;
    }

    ctr = 0;
    while (ctr < recv_data->size_msgs)
    {
        MPI_Probe(MPI_ANY_SOURCE, tag, local_comm, &recv_status);
        proc = recv_status.MPI_SOURCE;
        MPI_Get_count(&recv_status, MPI_INT, &size);
        if (size > recv_buffer.size())
            recv_buffer.resize(size);
        MPI_Recv(recv_buffer.data(), size, MPI_INT, proc, tag, local_comm, &recv_status);
        for (int i = 0; i < size; i += 2)
        {
            recv_data->indices[ctr] = recv_buffer[i];
            recv_idx_nodes[ctr++] = recv_buffer[i+1];
        }
        recv_data->procs[recv_data->num_msgs] = proc;
        recv_data->indptr[recv_data->num_msgs + 1] = recv_data->indptr[recv_data->num_msgs] + (size / 2);
        recv_data->num_msgs++;
    }

    if (send_data->num_msgs)
    {
        MPI_Waitall(send_data->num_msgs, send_requests.data(), MPI_STATUSES_IGNORE);
    }
}